

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

Connection __thiscall
QMetaObject::connectImpl
          (QMetaObject *this,QObject *sender,QMetaMethod *signal,QObject *receiver,void **slot,
          QSlotObjectBase *slotObjRaw,ConnectionType type)

{
  QSlotObjectBase *slotObjRaw_00;
  MethodType MVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  long in_FS_OFFSET;
  undefined1 local_80 [28];
  int signal_index;
  int dummy;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QSlotObjectBase *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = slotObjRaw;
  if (signal->mobj != (QMetaObject *)0x0) {
    MVar1 = QMetaMethod::methodType(signal);
    if (MVar1 == Signal) {
      signal_index = -0x55555556;
      dummy = -0x55555556;
      QMetaObjectPrivate::memberIndexes(sender,signal,&signal_index,&dummy);
      iVar2 = (**sender->_vptr_QObject)(sender);
      slotObjRaw_00 = local_40;
      if (signal_index == -1) {
        lcConnect();
        if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
        {
          dummy = 2;
          local_5c = 0;
          uStack_54 = 0;
          local_4c = 0;
          local_48 = lcConnect::category.name;
          QMetaMethod::methodSignature((QByteArray *)local_80,signal);
          pcVar3 = className((QMetaObject *)CONCAT44(extraout_var,iVar2));
          if ((uint *)local_80._8_8_ == (uint *)0x0) {
            local_80._8_8_ = "";
          }
          QMessageLogger::warning
                    ((QMessageLogger *)&dummy,
                     "QObject::connect: Can\'t find signal %s on instance of class %s",
                     local_80._8_8_,pcVar3);
          connectImpl((QMetaObject *)local_80);
        }
        Connection::Connection((Connection *)this);
      }
      else {
        local_40 = (QSlotObjectBase *)0x0;
        QObjectPrivate::connectImpl
                  ((QObjectPrivate *)this,sender,signal_index,receiver,slot,slotObjRaw_00,type,
                   (int *)0x0,(QMetaObject *)CONCAT44(extraout_var,iVar2));
      }
      goto LAB_002baa58;
    }
  }
  lcConnect();
  if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
    dummy = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = lcConnect::category.name;
    QMessageLogger::warning((QMessageLogger *)&dummy,"QObject::connect: invalid signal parameter");
  }
  Connection::Connection((Connection *)this);
LAB_002baa58:
  if (local_40 != (QSlotObjectBase *)0x0) {
    QtPrivate::QSlotObjectBase::Deleter::operator()((Deleter *)&local_40,local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Connection)this;
  }
  __stack_chk_fail();
}

Assistant:

QMetaObject::Connection QMetaObject::connectImpl(const QObject *sender, const QMetaMethod &signal,
                                             const QObject *receiver, void **slot,
                                             QtPrivate::QSlotObjectBase *slotObjRaw, Qt::ConnectionType type)
{
    QtPrivate::SlotObjUniquePtr slotObj(slotObjRaw);

    if (!signal.isValid() || signal.methodType() != QMetaMethod::Signal) {
        qCWarning(lcConnect, "QObject::connect: invalid signal parameter");
        return QMetaObject::Connection();
    }

    int signal_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
    }

    const QMetaObject *senderMetaObject = sender->metaObject();
    if (signal_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find signal %s on instance of class %s",
                  signal.methodSignature().constData(), senderMetaObject->className());
        return QMetaObject::Connection();
    }

    return QObjectPrivate::connectImpl(sender, signal_index, receiver, slot, slotObj.release(), type, nullptr, senderMetaObject);
}